

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O3

void __thiscall
persistence_computer_t<directed_flag_complex_computer::directed_flag_complex_computer_t>::
persistence_computer_t
          (persistence_computer_t<directed_flag_complex_computer::directed_flag_complex_computer_t>
           *this,directed_flag_complex_computer_t *_complex,
          output_t<directed_flag_complex_computer::directed_flag_complex_computer_t> *_output,
          size_t _max_entries,int _modulus,value_t _max_filtration)

{
  this->complex = _complex;
  this->output = _output;
  this->max_filtration = _max_filtration;
  this->max_entries = _max_entries;
  this->euler_characteristic = 0;
  this->print_betti_numbers_to_console = true;
  this->modulus = (coefficient_t)_modulus;
  multiplicative_inverse_vector(&this->multiplicative_inverse,(coefficient_t)_modulus);
  (this->columns_to_reduce).
  super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->columns_to_reduce).
  super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->columns_to_reduce).
  super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->columns_to_reduce).
  super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->columns_to_reduce).
  super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->columns_to_reduce).
  super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->columns_to_reduce).
  super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->columns_to_reduce).
  super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->columns_to_reduce).
  super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->columns_to_reduce).
  super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>::_M_initialize_map
            (&(this->columns_to_reduce).
              super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>,0);
  return;
}

Assistant:

persistence_computer_t(Complex& _complex, output_t<Complex>* _output,
	                       size_t _max_entries = std::numeric_limits<size_t>::max(), int _modulus = 2,
	                       value_t _max_filtration = std::numeric_limits<value_t>::max())
	    : complex(_complex), output(_output), max_filtration(_max_filtration), max_entries(_max_entries),
#ifdef USE_COEFFICIENTS
	      modulus(_modulus),
#endif
	      multiplicative_inverse(multiplicative_inverse_vector(modulus)) {
#ifndef USE_COEFFICIENTS
		if (_modulus != 2) {
			throw std::logic_error("If you want to use modulus != 2, please compile with coefficients.");
		}
#endif
	}